

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void __thiscall
embree::sse2::
BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
::occluded(BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
           *this,vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  OccludedFunc4 *pp_Var1;
  char **ppcVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  IntersectFunc4 p_Var21;
  OccludedFunc4 p_Var22;
  char *pcVar23;
  IntersectFunc4 p_Var24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [12];
  undefined1 auVar28 [16];
  undefined1 *puVar29;
  undefined1 *puVar30;
  long lVar31;
  ulong uVar32;
  RTCRayN *pRVar33;
  code *pcVar34;
  int iVar35;
  RayK<4> *pRVar36;
  NodeRef *pNVar37;
  undefined1 *puVar38;
  uint i;
  long lVar39;
  BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
  *pBVar40;
  undefined1 *puVar41;
  ulong uVar42;
  undefined1 *puVar43;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar44;
  bool bVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  float fVar58;
  float fVar76;
  float fVar77;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar64;
  undefined1 auVar65 [16];
  float fVar78;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar79;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar80;
  float fVar88;
  float fVar89;
  undefined1 auVar81 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar90;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar91;
  float fVar101;
  float fVar102;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  uint uVar103;
  uint uVar108;
  uint uVar109;
  undefined1 auVar104 [16];
  uint uVar110;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar111;
  float fVar112;
  float fVar116;
  float fVar118;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar117;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar115 [16];
  float fVar123;
  float fVar124;
  float fVar133;
  float fVar135;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar134;
  float fVar136;
  float fVar137;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar138;
  float fVar139;
  float fVar144;
  float fVar146;
  undefined1 auVar140 [16];
  float fVar148;
  undefined1 auVar141 [16];
  float fVar145;
  float fVar147;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar149;
  float fVar150;
  float fVar157;
  float fVar159;
  float fVar161;
  undefined1 auVar151 [16];
  float fVar158;
  float fVar160;
  float fVar162;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar163;
  float fVar167;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar168;
  undefined1 auVar166 [16];
  float fVar169;
  float fVar170;
  float fVar175;
  float fVar177;
  undefined1 auVar171 [16];
  float fVar176;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar181;
  float fVar182;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar183 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar200;
  float fVar201;
  float fVar202;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar199;
  float fVar203;
  float fVar204;
  float fVar208;
  float fVar210;
  undefined1 auVar205 [16];
  float fVar209;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  uint local_1a48;
  uint uStack_1a44;
  uint uStack_1a40;
  uint uStack_1a3c;
  undefined1 local_19d8 [16];
  float local_19c8;
  float fStack_19c4;
  float fStack_19c0;
  float fStack_19bc;
  float local_19b8;
  float fStack_19b4;
  float fStack_19b0;
  float fStack_19ac;
  undefined1 local_1958 [16];
  undefined1 local_1948 [16];
  undefined1 local_1938 [8];
  float fStack_1930;
  undefined1 local_1928 [8];
  float fStack_1920;
  float fStack_191c;
  float local_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  undefined1 local_1908 [8];
  float fStack_1900;
  float fStack_18fc;
  RTCFilterFunctionNArguments args;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined1 local_1848 [8];
  float fStack_1840;
  float fStack_183c;
  float local_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float local_1828;
  float fStack_1824;
  float fStack_1820;
  float fStack_181c;
  undefined1 local_1818 [16];
  uint local_1808;
  uint uStack_1804;
  uint uStack_1800;
  uint uStack_17fc;
  undefined4 local_17f8;
  undefined4 uStack_17f4;
  undefined4 uStack_17f0;
  undefined4 uStack_17ec;
  uint local_17e8;
  uint uStack_17e4;
  uint uStack_17e0;
  uint uStack_17dc;
  undefined4 local_17d8;
  undefined4 uStack_17d4;
  undefined4 uStack_17d0;
  undefined4 uStack_17cc;
  undefined4 local_17c8;
  undefined4 uStack_17c4;
  undefined4 uStack_17c0;
  undefined4 uStack_17bc;
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  undefined1 local_1788 [16];
  float local_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  undefined1 local_16e8 [8];
  float fStack_16e0;
  float fStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  puVar43 = *(undefined1 **)((valid_i->field_0).v[0] + 0x70);
  if (puVar43 != (undefined1 *)0x8) {
    pRVar36 = ray;
    if ((*(long *)(ray + 8) != 0) &&
       (pRVar36 = *(RayK<4> **)(ray + 0x10), ((byte)pRVar36[2] & 1) != 0)) {
      occludedCoherent(this,valid_i,This,ray,context);
      return;
    }
    auVar59 = *(undefined1 (*) [16])&(This->intersector4_nofilter).name;
    auVar104._0_4_ = -(uint)(*(int *)this == -1 && 0.0 <= auVar59._0_4_);
    auVar104._4_4_ = -(uint)(*(int *)(this + 4) == -1 && 0.0 <= auVar59._4_4_);
    auVar104._8_4_ = -(uint)(*(int *)(this + 8) == -1 && 0.0 <= auVar59._8_4_);
    auVar104._12_4_ = -(uint)(*(int *)(this + 0xc) == -1 && 0.0 <= auVar59._12_4_);
    iVar35 = movmskps((int)pRVar36,auVar104);
    if (iVar35 != 0) {
      auVar92._0_8_ = (This->intersector1).pointQuery;
      auVar92._8_8_ = (This->intersector1).name;
      auVar92 = maxps(auVar92,(undefined1  [16])0x0);
      auVar93._0_4_ = auVar92._0_4_ & auVar104._0_4_;
      auVar93._4_4_ = auVar92._4_4_ & auVar104._4_4_;
      auVar93._8_4_ = auVar92._8_4_ & auVar104._8_4_;
      auVar93._12_4_ = auVar92._12_4_ & auVar104._12_4_;
      auVar171._0_8_ = CONCAT44(~auVar104._4_4_,~auVar104._0_4_) & 0x7f8000007f800000;
      auVar171._8_4_ = ~auVar104._8_4_ & 0x7f800000;
      auVar171._12_4_ = ~auVar104._12_4_ & 0x7f800000;
      if (*(long *)(ray + 8) == 0) {
        puVar41 = (undefined1 *)0x3;
      }
      else {
        puVar41 = (undefined1 *)((ulong)((*(byte *)(*(long *)(ray + 0x10) + 2) & 1) == 0) + 2);
      }
      auVar125._0_8_ = (This->intersector4).intersect;
      auVar125._8_8_ = (This->intersector4).occluded;
      auVar92 = *(undefined1 (*) [16])&(This->intersector4).name;
      auVar174._0_8_ = (This->intersector4_filter).occluded;
      auVar174._8_8_ = (This->intersector4_filter).name;
      fVar13 = *(float *)&This->ptr;
      fVar14 = *(float *)((long)&This->ptr + 4);
      fVar15 = *(float *)&This->leafIntersector;
      fVar16 = *(float *)((long)&This->leafIntersector + 4);
      fVar9 = *(float *)&(This->collider).collide;
      fVar10 = *(float *)((long)&(This->collider).collide + 4);
      fVar11 = *(float *)&(This->collider).name;
      fVar12 = *(float *)((long)&(This->collider).name + 4);
      fVar17 = *(float *)&(This->intersector1).intersect;
      fVar18 = *(float *)((long)&(This->intersector1).intersect + 4);
      fVar19 = *(float *)&(This->intersector1).occluded;
      fVar20 = *(float *)((long)&(This->intersector1).occluded + 4);
      uVar42 = CONCAT44(auVar104._4_4_,auVar104._0_4_);
      local_19d8._0_8_ = uVar42 ^ 0xffffffffffffffff;
      local_19d8._8_4_ = auVar104._8_4_ ^ 0xffffffff;
      local_19d8._12_4_ = auVar104._12_4_ ^ 0xffffffff;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = (size_t)puVar43;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar171 | auVar93);
      if (puVar43 != (undefined1 *)0xfffffffffffffff8) {
        fVar149 = (float)DAT_01f80d30;
        fVar157 = DAT_01f80d30._4_4_;
        fVar159 = DAT_01f80d30._8_4_;
        fVar161 = DAT_01f80d30._12_4_;
        auVar94 = divps(_DAT_01f7ba10,auVar174);
        uVar46 = -(uint)(fVar149 <= ABS((float)auVar125._0_8_));
        uVar49 = -(uint)(fVar157 <= ABS((float)((ulong)auVar125._0_8_ >> 0x20)));
        uVar52 = -(uint)(fVar159 <= ABS((float)auVar125._8_8_));
        uVar55 = -(uint)(fVar161 <= ABS((float)((ulong)auVar125._8_8_ >> 0x20)));
        auVar125 = divps(_DAT_01f7ba10,auVar125);
        uVar47 = -(uint)(fVar149 <= ABS(auVar92._0_4_));
        uVar50 = -(uint)(fVar157 <= ABS(auVar92._4_4_));
        uVar53 = -(uint)(fVar159 <= ABS(auVar92._8_4_));
        uVar56 = -(uint)(fVar161 <= ABS(auVar92._12_4_));
        auVar92 = divps(_DAT_01f7ba10,auVar92);
        uVar48 = -(uint)(fVar149 <= ABS((float)auVar174._0_8_));
        uVar51 = -(uint)(fVar157 <= ABS((float)((ulong)auVar174._0_8_ >> 0x20)));
        uVar54 = -(uint)(fVar159 <= ABS((float)auVar174._8_8_));
        uVar57 = -(uint)(fVar161 <= ABS((float)((ulong)auVar174._8_8_ >> 0x20)));
        uVar103 = (uint)DAT_01fab950;
        uVar108 = DAT_01fab950._4_4_;
        uVar109 = DAT_01fab950._8_4_;
        uVar110 = DAT_01fab950._12_4_;
        auVar59 = maxps(auVar59,_DAT_01f7aa10);
        auVar126._0_4_ = auVar125._0_4_ & uVar46;
        auVar126._4_4_ = auVar125._4_4_ & uVar49;
        auVar126._8_4_ = auVar125._8_4_ & uVar52;
        auVar126._12_4_ = auVar125._12_4_ & uVar55;
        auVar205._0_4_ = ~uVar46 & uVar103;
        auVar205._4_4_ = ~uVar49 & uVar108;
        auVar205._8_4_ = ~uVar52 & uVar109;
        auVar205._12_4_ = ~uVar55 & uVar110;
        auVar205 = auVar205 | auVar126;
        auVar113._0_4_ = auVar92._0_4_ & uVar47;
        auVar113._4_4_ = auVar92._4_4_ & uVar50;
        auVar113._8_4_ = auVar92._8_4_ & uVar53;
        auVar113._12_4_ = auVar92._12_4_ & uVar56;
        auVar81._0_4_ = ~uVar47 & uVar103;
        auVar81._4_4_ = ~uVar50 & uVar108;
        auVar81._8_4_ = ~uVar53 & uVar109;
        auVar81._12_4_ = ~uVar56 & uVar110;
        _local_16e8 = auVar81 | auVar113;
        fVar149 = (float)(~uVar48 & uVar103 | auVar94._0_4_ & uVar48);
        fVar157 = (float)(~uVar51 & uVar108 | auVar94._4_4_ & uVar51);
        fVar159 = (float)(~uVar54 & uVar109 | auVar94._8_4_ & uVar54);
        fVar161 = (float)(~uVar57 & uVar110 | auVar94._12_4_ & uVar57);
        local_1918 = (float)(~auVar104._0_4_ & 0xff800000 | auVar59._0_4_ & auVar104._0_4_);
        fStack_1914 = (float)(~auVar104._4_4_ & 0xff800000 | auVar59._4_4_ & auVar104._4_4_);
        fStack_1910 = (float)(~auVar104._8_4_ & 0xff800000 | auVar59._8_4_ & auVar104._8_4_);
        fStack_190c = (float)(~auVar104._12_4_ & 0xff800000 | auVar59._12_4_ & auVar104._12_4_);
        pNVar37 = stack_node + 1;
        puVar30 = mm_lookupmask_ps;
        auVar59._8_4_ = 0xffffffff;
        auVar59._0_8_ = 0xffffffffffffffff;
        auVar59._12_4_ = 0xffffffff;
        local_1788 = mm_lookupmask_ps._0_16_;
        local_1798 = mm_lookupmask_ps._0_16_ ^ auVar59;
        local_17a8 = mm_lookupmask_ps._240_16_;
        local_17b8 = mm_lookupmask_ps._240_16_ ^ auVar59;
        paVar44 = &stack_near[2].field_0;
        aVar199 = _DAT_01f7a9f0;
LAB_001b3b49:
        aVar64 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar44[-1].v;
        paVar44 = paVar44 + -1;
        auVar94._4_4_ = -(uint)(aVar64.v[1] < fStack_1914);
        auVar94._0_4_ = -(uint)(aVar64.v[0] < local_1918);
        auVar94._8_4_ = -(uint)(aVar64.v[2] < fStack_1910);
        auVar94._12_4_ = -(uint)(aVar64._12_4_ < fStack_190c);
        uVar46 = movmskps((int)puVar30,auVar94);
        puVar30 = (undefined1 *)(ulong)uVar46;
        if (uVar46 != 0) {
          do {
            if (((ulong)puVar43 & 8) != 0) {
              if (puVar43 == (undefined1 *)0xfffffffffffffff8) goto LAB_001b50c3;
              auVar84._4_4_ = -(uint)(aVar64.v[1] < fStack_1914);
              auVar84._0_4_ = -(uint)(aVar64.v[0] < local_1918);
              auVar84._8_4_ = -(uint)(aVar64.v[2] < fStack_1910);
              auVar84._12_4_ = -(uint)(aVar64.v[3] < fStack_190c);
              uVar46 = movmskps((int)puVar30,auVar84);
              puVar30 = (undefined1 *)(ulong)uVar46;
              if (uVar46 == 0) goto LAB_001b50b1;
              this = (BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
                      *)((ulong)((uint)puVar43 & 0xf) - 8);
              auVar75 = local_19d8;
              if (this == (BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
                           *)0x0) goto LAB_001b5084;
              auVar65._0_8_ = local_19d8._0_8_ ^ 0xffffffffffffffff;
              auVar65._8_4_ = local_19d8._8_4_ ^ 0xffffffff;
              auVar65._12_4_ = local_19d8._12_4_ ^ 0xffffffff;
              lVar39 = ((ulong)puVar43 & 0xfffffffffffffff0) + 0xc0;
              pBVar40 = (BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
                         *)0x0;
              goto LAB_001b3d48;
            }
            lVar39 = 0;
            puVar38 = (undefined1 *)0x8;
            aVar82 = aVar199;
            do {
              puVar30 = *(undefined1 **)(((ulong)puVar43 & 0xfffffffffffffff0) + lVar39 * 8);
              aVar64 = aVar82;
              if (puVar30 == (undefined1 *)0x8) break;
              fVar138 = *(float *)(puVar43 + lVar39 * 4 + 0x20);
              fVar144 = *(float *)(puVar43 + lVar39 * 4 + 0x30);
              fVar146 = *(float *)(puVar43 + lVar39 * 4 + 0x40);
              fVar148 = *(float *)(puVar43 + lVar39 * 4 + 0x50);
              auVar95._0_8_ =
                   CONCAT44((fVar138 - fVar14) * auVar205._4_4_,(fVar138 - fVar13) * auVar205._0_4_)
              ;
              auVar95._8_4_ = (fVar138 - fVar15) * auVar205._8_4_;
              auVar95._12_4_ = (fVar138 - fVar16) * auVar205._12_4_;
              auVar60._0_8_ =
                   CONCAT44((fVar146 - fVar10) * (float)local_16e8._4_4_,
                            (fVar146 - fVar9) * (float)local_16e8._0_4_);
              auVar60._8_4_ = (fVar146 - fVar11) * fStack_16e0;
              auVar60._12_4_ = (fVar146 - fVar12) * fStack_16dc;
              fVar138 = *(float *)(puVar43 + lVar39 * 4 + 0x60);
              auVar127._0_8_ = CONCAT44((fVar138 - fVar18) * fVar157,(fVar138 - fVar17) * fVar149);
              auVar127._8_4_ = (fVar138 - fVar19) * fVar159;
              auVar127._12_4_ = (fVar138 - fVar20) * fVar161;
              auVar105._0_4_ = (fVar144 - fVar13) * auVar205._0_4_;
              auVar105._4_4_ = (fVar144 - fVar14) * auVar205._4_4_;
              auVar105._8_4_ = (fVar144 - fVar15) * auVar205._8_4_;
              auVar105._12_4_ = (fVar144 - fVar16) * auVar205._12_4_;
              auVar114._0_4_ = (fVar148 - fVar9) * (float)local_16e8._0_4_;
              auVar114._4_4_ = (fVar148 - fVar10) * (float)local_16e8._4_4_;
              auVar114._8_4_ = (fVar148 - fVar11) * fStack_16e0;
              auVar114._12_4_ = (fVar148 - fVar12) * fStack_16dc;
              fVar138 = *(float *)(puVar43 + lVar39 * 4 + 0x70);
              auVar151._0_4_ = (fVar138 - fVar17) * fVar149;
              auVar151._4_4_ = (fVar138 - fVar18) * fVar157;
              auVar151._8_4_ = (fVar138 - fVar19) * fVar159;
              auVar151._12_4_ = (fVar138 - fVar20) * fVar161;
              auVar140._8_4_ = auVar95._8_4_;
              auVar140._0_8_ = auVar95._0_8_;
              auVar140._12_4_ = auVar95._12_4_;
              auVar59 = minps(auVar140,auVar105);
              auVar164._8_4_ = auVar60._8_4_;
              auVar164._0_8_ = auVar60._0_8_;
              auVar164._12_4_ = auVar60._12_4_;
              auVar92 = minps(auVar164,auVar114);
              auVar59 = maxps(auVar59,auVar92);
              auVar165._8_4_ = auVar127._8_4_;
              auVar165._0_8_ = auVar127._0_8_;
              auVar165._12_4_ = auVar127._12_4_;
              auVar92 = minps(auVar165,auVar151);
              auVar125 = maxps(auVar59,auVar92);
              auVar92 = maxps(auVar95,auVar105);
              auVar59 = maxps(auVar60,auVar114);
              auVar59 = minps(auVar92,auVar59);
              auVar92 = maxps(auVar127,auVar151);
              fVar138 = auVar125._0_4_ * 0.99999964;
              fVar144 = auVar125._4_4_ * 0.99999964;
              auVar61._4_4_ = fVar144;
              auVar61._0_4_ = fVar138;
              fVar146 = auVar125._8_4_ * 0.99999964;
              fVar148 = auVar125._12_4_ * 0.99999964;
              auVar59 = minps(auVar59,auVar92);
              auVar96._0_4_ = auVar59._0_4_ * 1.0000004;
              auVar96._4_4_ = auVar59._4_4_ * 1.0000004;
              auVar96._8_4_ = auVar59._8_4_ * 1.0000004;
              auVar96._12_4_ = auVar59._12_4_ * 1.0000004;
              auVar61._8_4_ = fVar146;
              auVar61._12_4_ = fVar148;
              auVar59 = maxps(auVar61,auVar171 | auVar93);
              auVar25._4_4_ = fStack_1914;
              auVar25._0_4_ = local_1918;
              auVar25._8_4_ = fStack_1910;
              auVar25._12_4_ = fStack_190c;
              auVar92 = minps(auVar96,auVar25);
              uVar47 = -(uint)(auVar59._0_4_ <= auVar92._0_4_);
              uVar48 = -(uint)(auVar59._4_4_ <= auVar92._4_4_);
              uVar49 = -(uint)(auVar59._8_4_ <= auVar92._8_4_);
              uVar50 = -(uint)(auVar59._12_4_ <= auVar92._12_4_);
              auVar62._4_4_ = uVar48;
              auVar62._0_4_ = uVar47;
              auVar62._8_4_ = uVar49;
              auVar62._12_4_ = uVar50;
              uVar46 = movmskps((int)this,auVar62);
              this = (BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
                      *)(ulong)uVar46;
              puVar29 = puVar38;
              if ((uVar46 != 0) &&
                 (auVar141._0_4_ = (uint)fVar138 & uVar47, auVar141._4_4_ = (uint)fVar144 & uVar48,
                 auVar141._8_4_ = (uint)fVar146 & uVar49, auVar141._12_4_ = (uint)fVar148 & uVar50,
                 auVar63._0_4_ = ~uVar47 & aVar199.i[0], auVar63._4_4_ = ~uVar48 & aVar199.i[1],
                 auVar63._8_4_ = ~uVar49 & aVar199.i[2], auVar63._12_4_ = ~uVar50 & aVar199.i[3],
                 puVar29 = puVar30,
                 aVar64 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar63 | auVar141),
                 puVar38 != (undefined1 *)0x8)) {
                pNVar37->ptr = (size_t)puVar38;
                pNVar37 = pNVar37 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar44->v = aVar82;
                paVar44 = paVar44 + 1;
              }
              puVar38 = puVar29;
              lVar39 = lVar39 + 1;
              aVar82 = aVar64;
            } while (lVar39 != 4);
            puVar30 = puVar43;
            if (puVar38 == (undefined1 *)0x8) goto LAB_001b50b1;
            auVar83._4_4_ = -(uint)(aVar64.v[1] < fStack_1914);
            auVar83._0_4_ = -(uint)(aVar64.v[0] < local_1918);
            auVar83._8_4_ = -(uint)(aVar64.v[2] < fStack_1910);
            auVar83._12_4_ = -(uint)(aVar64.v[3] < fStack_190c);
            uVar46 = movmskps((uint)puVar43,auVar83);
            puVar30 = (undefined1 *)
                      ((ulong)(byte)((byte)uVar46 >> 3) +
                      (ulong)((uVar46 >> 1 & 1) + (uVar46 & 1) + (uint)((uVar46 >> 2 & 1) != 0)));
            puVar43 = puVar38;
          } while (puVar41 < puVar30);
          pNVar37->ptr = (size_t)puVar38;
          pNVar37 = pNVar37 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar44->v = aVar64;
          paVar44 = paVar44 + 1;
        }
        goto LAB_001b50b1;
      }
LAB_001b50c3:
      uVar46 = *(uint *)((long)&(This->intersector4_nofilter).name + 4);
      uVar47 = *(uint *)&(This->intersector8).intersect;
      uVar48 = *(uint *)((long)&(This->intersector8).intersect + 4);
      *(uint *)&(This->intersector4_nofilter).name =
           ~(auVar104._0_4_ & local_19d8._0_4_) & *(uint *)&(This->intersector4_nofilter).name |
           auVar104._0_4_ & local_19d8._0_4_ & 0xff800000;
      *(uint *)((long)&(This->intersector4_nofilter).name + 4) =
           ~(auVar104._4_4_ & local_19d8._4_4_) & uVar46 |
           auVar104._4_4_ & local_19d8._4_4_ & 0xff800000;
      *(uint *)&(This->intersector8).intersect =
           ~(auVar104._8_4_ & local_19d8._8_4_) & uVar47 |
           auVar104._8_4_ & local_19d8._8_4_ & 0xff800000;
      *(uint *)((long)&(This->intersector8).intersect + 4) =
           ~(auVar104._12_4_ & local_19d8._12_4_) & uVar48 |
           auVar104._12_4_ & local_19d8._12_4_ & 0xff800000;
    }
  }
  return;
  while( true ) {
    pBVar40 = pBVar40 + 1;
    lVar39 = lVar39 + 0xe0;
    if (this <= pBVar40) break;
LAB_001b3d48:
    lVar31 = (long)pBVar40 * 0xe0 + ((ulong)puVar43 & 0xfffffffffffffff0);
    uVar42 = 0;
    auVar59 = auVar65;
    local_1948 = auVar65;
    while( true ) {
      local_17e8 = *(uint *)(lVar39 + uVar42 * 4);
      uVar32 = (ulong)local_17e8;
      if (uVar32 == 0xffffffff) break;
      fVar138 = *(float *)(lVar39 + -0xc0 + uVar42 * 4);
      fVar144 = *(float *)(lVar39 + -0xb0 + uVar42 * 4);
      fVar146 = *(float *)(lVar39 + -0xa0 + uVar42 * 4);
      local_1718 = *(float *)(lVar39 + -0x90 + uVar42 * 4);
      local_1738 = *(float *)(lVar39 + -0x80 + uVar42 * 4);
      local_1728 = *(float *)(lVar39 + -0x70 + uVar42 * 4);
      fVar148 = *(float *)(lVar39 + -0x60 + uVar42 * 4);
      fVar168 = *(float *)(lVar39 + -0x50 + uVar42 * 4);
      fVar197 = *(float *)(lVar39 + -0x40 + uVar42 * 4);
      local_1758 = *(float *)(lVar39 + -0x30 + uVar42 * 4);
      local_1748 = *(float *)(lVar39 + -0x20 + uVar42 * 4);
      local_1928._4_4_ = *(float *)(lVar39 + -0x10 + uVar42 * 4);
      local_1858 = *(undefined8 *)(lVar31 + 0xd0);
      uStack_1850 = *(undefined8 *)(lVar31 + 0xd8);
      fVar58 = *(float *)&This->ptr;
      fVar76 = *(float *)((long)&This->ptr + 4);
      fVar77 = *(float *)&This->leafIntersector;
      fVar78 = *(float *)((long)&This->leafIntersector + 4);
      fVar193 = *(float *)&(This->collider).collide;
      fVar194 = *(float *)((long)&(This->collider).collide + 4);
      fVar195 = *(float *)&(This->collider).name;
      fVar196 = *(float *)((long)&(This->collider).name + 4);
      fVar123 = fVar138 - fVar58;
      fVar133 = fVar138 - fVar76;
      fVar135 = fVar138 - fVar77;
      fVar138 = fVar138 - fVar78;
      fVar139 = fVar144 - fVar193;
      fVar145 = fVar144 - fVar194;
      fVar147 = fVar144 - fVar195;
      fVar144 = fVar144 - fVar196;
      fStack_1714 = local_1718;
      fStack_1710 = local_1718;
      fStack_170c = local_1718;
      fVar203 = local_1718 - fVar58;
      fVar208 = local_1718 - fVar76;
      fVar210 = local_1718 - fVar77;
      fVar212 = local_1718 - fVar78;
      fStack_1754 = local_1758;
      fStack_1750 = local_1758;
      fStack_174c = local_1758;
      fVar58 = local_1758 - fVar58;
      fVar76 = local_1758 - fVar76;
      fVar77 = local_1758 - fVar77;
      fVar78 = local_1758 - fVar78;
      fStack_1734 = local_1738;
      fStack_1730 = local_1738;
      fStack_172c = local_1738;
      fVar169 = local_1738 - fVar193;
      fVar175 = local_1738 - fVar194;
      fVar177 = local_1738 - fVar195;
      fVar179 = local_1738 - fVar196;
      fStack_1744 = local_1748;
      fStack_1740 = local_1748;
      fStack_173c = local_1748;
      fVar193 = local_1748 - fVar193;
      fVar194 = local_1748 - fVar194;
      fVar195 = local_1748 - fVar195;
      fVar196 = local_1748 - fVar196;
      fVar198 = *(float *)&(This->intersector1).intersect;
      fVar200 = *(float *)((long)&(This->intersector1).intersect + 4);
      fVar201 = *(float *)&(This->intersector1).occluded;
      fVar202 = *(float *)((long)&(This->intersector1).occluded + 4);
      fVar181 = fVar146 - fVar198;
      fVar184 = fVar146 - fVar200;
      fVar186 = fVar146 - fVar201;
      fVar146 = fVar146 - fVar202;
      fStack_1724 = local_1728;
      fStack_1720 = local_1728;
      fStack_171c = local_1728;
      fVar204 = local_1728 - fVar198;
      fVar209 = local_1728 - fVar200;
      fVar211 = local_1728 - fVar201;
      fVar213 = local_1728 - fVar202;
      local_1928._0_4_ = local_1928._4_4_;
      fStack_1920 = (float)local_1928._4_4_;
      fStack_191c = (float)local_1928._4_4_;
      fVar198 = (float)local_1928._4_4_ - fVar198;
      fVar200 = (float)local_1928._4_4_ - fVar200;
      fVar201 = (float)local_1928._4_4_ - fVar201;
      fVar202 = (float)local_1928._4_4_ - fVar202;
      fVar111 = fVar58 - fVar123;
      fVar116 = fVar76 - fVar133;
      fVar118 = fVar77 - fVar135;
      fVar120 = fVar78 - fVar138;
      local_16f8 = fVar193 - fVar139;
      fStack_16f4 = fVar194 - fVar145;
      fStack_16f0 = fVar195 - fVar147;
      fStack_16ec = fVar196 - fVar144;
      fVar124 = fVar198 - fVar181;
      fVar134 = fVar200 - fVar184;
      fVar136 = fVar201 - fVar186;
      fVar137 = fVar202 - fVar146;
      pp_Var1 = &(This->intersector4_filter).occluded;
      auVar27 = *(undefined1 (*) [12])pp_Var1;
      fVar122 = *(float *)((long)&(This->intersector4_filter).name + 4);
      fVar79 = *(float *)&(This->intersector4).name;
      fVar80 = *(float *)((long)&(This->intersector4).name + 4);
      fVar88 = *(float *)&(This->intersector4_filter).intersect;
      fVar89 = *(float *)((long)&(This->intersector4_filter).intersect + 4);
      fVar90 = *(float *)&(This->intersector4).intersect;
      fVar91 = *(float *)((long)&(This->intersector4).intersect + 4);
      fVar101 = *(float *)&(This->intersector4).occluded;
      fVar102 = *(float *)((long)&(This->intersector4).occluded + 4);
      fVar163 = (local_16f8 * (fVar198 + fVar181) - (fVar193 + fVar139) * fVar124) * fVar90 +
                ((fVar58 + fVar123) * fVar124 - (fVar198 + fVar181) * fVar111) * fVar79 +
                (fVar111 * (fVar193 + fVar139) - (fVar58 + fVar123) * local_16f8) *
                *(float *)pp_Var1;
      fVar167 = (fStack_16f4 * (fVar200 + fVar184) - (fVar194 + fVar145) * fVar134) * fVar91 +
                ((fVar76 + fVar133) * fVar134 - (fVar200 + fVar184) * fVar116) * fVar80 +
                (fVar116 * (fVar194 + fVar145) - (fVar76 + fVar133) * fStack_16f4) *
                *(float *)((long)&(This->intersector4_filter).occluded + 4);
      local_1938 = CONCAT44(fVar167,fVar163);
      fStack_1930 = (fStack_16f0 * (fVar201 + fVar186) - (fVar195 + fVar147) * fVar136) * fVar101 +
                    ((fVar77 + fVar135) * fVar136 - (fVar201 + fVar186) * fVar118) * fVar88 +
                    (fVar118 * (fVar195 + fVar147) - (fVar77 + fVar135) * fStack_16f0) *
                    *(float *)&(This->intersector4_filter).name;
      register0x0000140c =
           (fStack_16ec * (fVar202 + fVar146) - (fVar196 + fVar144) * fVar137) * fVar102 +
           ((fVar78 + fVar138) * fVar137 - (fVar202 + fVar146) * fVar120) * fVar89 +
           (fVar120 * (fVar196 + fVar144) - (fVar78 + fVar138) * fStack_16ec) * fVar122;
      local_1708 = fVar123 - fVar203;
      fStack_1704 = fVar133 - fVar208;
      fStack_1700 = fVar135 - fVar210;
      fStack_16fc = fVar138 - fVar212;
      fVar150 = fVar139 - fVar169;
      fVar158 = fVar145 - fVar175;
      fVar160 = fVar147 - fVar177;
      fVar162 = fVar144 - fVar179;
      fVar170 = fVar181 - fVar204;
      fVar176 = fVar184 - fVar209;
      fVar178 = fVar186 - fVar211;
      fVar180 = fVar146 - fVar213;
      local_19c8 = auVar27._0_4_;
      fStack_19c4 = auVar27._4_4_;
      fStack_19c0 = auVar27._8_4_;
      local_1908._0_4_ =
           (fVar150 * (fVar181 + fVar204) - (fVar139 + fVar169) * fVar170) * fVar90 +
           ((fVar123 + fVar203) * fVar170 - (fVar181 + fVar204) * local_1708) * fVar79 +
           (local_1708 * (fVar139 + fVar169) - (fVar123 + fVar203) * fVar150) * local_19c8;
      local_1908._4_4_ =
           (fVar158 * (fVar184 + fVar209) - (fVar145 + fVar175) * fVar176) * fVar91 +
           ((fVar133 + fVar208) * fVar176 - (fVar184 + fVar209) * fStack_1704) * fVar80 +
           (fStack_1704 * (fVar145 + fVar175) - (fVar133 + fVar208) * fVar158) * fStack_19c4;
      fStack_1900 = (fVar160 * (fVar186 + fVar211) - (fVar147 + fVar177) * fVar178) * fVar101 +
                    ((fVar135 + fVar210) * fVar178 - (fVar186 + fVar211) * fStack_1700) * fVar88 +
                    (fStack_1700 * (fVar147 + fVar177) - (fVar135 + fVar210) * fVar160) *
                    fStack_19c0;
      fStack_18fc = (fVar162 * (fVar146 + fVar213) - (fVar144 + fVar179) * fVar180) * fVar102 +
                    ((fVar138 + fVar212) * fVar180 - (fVar146 + fVar213) * fStack_16fc) * fVar89 +
                    (fStack_16fc * (fVar144 + fVar179) - (fVar138 + fVar212) * fVar162) * fVar122;
      fVar182 = fVar203 - fVar58;
      fVar185 = fVar208 - fVar76;
      fVar187 = fVar210 - fVar77;
      fVar188 = fVar212 - fVar78;
      fVar112 = fVar169 - fVar193;
      fVar117 = fVar175 - fVar194;
      fVar119 = fVar177 - fVar195;
      fVar121 = fVar179 - fVar196;
      fVar189 = fVar204 - fVar198;
      fVar190 = fVar209 - fVar200;
      fVar191 = fVar211 - fVar201;
      fVar192 = fVar213 - fVar202;
      auVar85._0_4_ =
           (fVar112 * (fVar198 + fVar204) - (fVar193 + fVar169) * fVar189) * fVar90 +
           ((fVar58 + fVar203) * fVar189 - (fVar198 + fVar204) * fVar182) * fVar79 +
           (fVar182 * (fVar193 + fVar169) - (fVar58 + fVar203) * fVar112) * local_19c8;
      auVar85._4_4_ =
           (fVar117 * (fVar200 + fVar209) - (fVar194 + fVar175) * fVar190) * fVar91 +
           ((fVar76 + fVar208) * fVar190 - (fVar200 + fVar209) * fVar185) * fVar80 +
           (fVar185 * (fVar194 + fVar175) - (fVar76 + fVar208) * fVar117) * fStack_19c4;
      auVar85._8_4_ =
           (fVar119 * (fVar201 + fVar211) - (fVar195 + fVar177) * fVar191) * fVar101 +
           ((fVar77 + fVar210) * fVar191 - (fVar201 + fVar211) * fVar187) * fVar88 +
           (fVar187 * (fVar195 + fVar177) - (fVar77 + fVar210) * fVar119) * fStack_19c0;
      auVar85._12_4_ =
           (fVar121 * (fVar202 + fVar213) - (fVar196 + fVar179) * fVar192) * fVar102 +
           ((fVar78 + fVar212) * fVar192 - (fVar202 + fVar213) * fVar188) * fVar89 +
           (fVar188 * (fVar196 + fVar179) - (fVar78 + fVar212) * fVar121) * fVar122;
      fVar193 = fVar163 + (float)local_1908._0_4_ + auVar85._0_4_;
      fVar194 = fVar167 + (float)local_1908._4_4_ + auVar85._4_4_;
      fVar195 = fStack_1930 + fStack_1900 + auVar85._8_4_;
      fVar196 = register0x0000140c + fStack_18fc + auVar85._12_4_;
      auVar142._8_4_ = fStack_1930;
      auVar142._0_8_ = local_1938;
      auVar142._12_4_ = register0x0000140c;
      auVar92 = minps(auVar142,_local_1908);
      auVar125 = minps(auVar92,auVar85);
      auVar66._8_4_ = fStack_1930;
      auVar66._0_8_ = local_1938;
      auVar66._12_4_ = register0x0000140c;
      auVar92 = maxps(auVar66,_local_1908);
      auVar92 = maxps(auVar92,auVar85);
      fVar58 = ABS(fVar193);
      fVar76 = ABS(fVar194);
      fVar77 = ABS(fVar195);
      fVar78 = ABS(fVar196);
      auVar67._4_4_ = -(uint)(auVar92._4_4_ <= fVar76 * 1.1920929e-07);
      auVar67._0_4_ = -(uint)(auVar92._0_4_ <= fVar58 * 1.1920929e-07);
      auVar67._8_4_ = -(uint)(auVar92._8_4_ <= fVar77 * 1.1920929e-07);
      auVar67._12_4_ = -(uint)(auVar92._12_4_ <= fVar78 * 1.1920929e-07);
      auVar143._4_4_ = -(uint)(-(fVar76 * 1.1920929e-07) <= auVar125._4_4_);
      auVar143._0_4_ = -(uint)(-(fVar58 * 1.1920929e-07) <= auVar125._0_4_);
      auVar143._8_4_ = -(uint)(-(fVar77 * 1.1920929e-07) <= auVar125._8_4_);
      auVar143._12_4_ = -(uint)(-(fVar78 * 1.1920929e-07) <= auVar125._12_4_);
      auVar67 = auVar67 | auVar143;
      auVar68._0_4_ = auVar67._0_4_ & auVar59._0_4_;
      auVar68._4_4_ = auVar67._4_4_ & auVar59._4_4_;
      auVar68._8_4_ = auVar67._8_4_ & auVar59._8_4_;
      auVar68._12_4_ = auVar67._12_4_ & auVar59._12_4_;
      iVar35 = movmskps((int)lVar31,auVar68);
      aVar199 = _DAT_01f7a9f0;
      args.ray = (RTCRayN *)This;
      if (iVar35 != 0) {
        local_1778 = fVar58;
        fStack_1774 = fVar76;
        fStack_1770 = fVar77;
        fStack_176c = fVar78;
        local_1768 = fVar193;
        fStack_1764 = fVar194;
        fStack_1760 = fVar195;
        fStack_175c = fVar196;
        uVar46 = -(uint)(ABS(fVar112 * fVar170) <= ABS(fVar150 * fVar124));
        uVar49 = -(uint)(ABS(fVar117 * fVar176) <= ABS(fVar158 * fVar134));
        uVar52 = -(uint)(ABS(fVar119 * fVar178) <= ABS(fVar160 * fVar136));
        uVar55 = -(uint)(ABS(fVar121 * fVar180) <= ABS(fVar162 * fVar137));
        uVar47 = -(uint)(ABS(local_1708 * fVar189) <= ABS(fVar111 * fVar170));
        uVar50 = -(uint)(ABS(fStack_1704 * fVar190) <= ABS(fVar116 * fVar176));
        uVar53 = -(uint)(ABS(fStack_1700 * fVar191) <= ABS(fVar118 * fVar178));
        uVar56 = -(uint)(ABS(fStack_16fc * fVar192) <= ABS(fVar120 * fVar180));
        uVar48 = -(uint)(ABS(fVar182 * fVar150) <= ABS(local_1708 * local_16f8));
        uVar51 = -(uint)(ABS(fVar185 * fVar158) <= ABS(fStack_1704 * fStack_16f4));
        uVar54 = -(uint)(ABS(fVar187 * fVar160) <= ABS(fStack_1700 * fStack_16f0));
        uVar57 = -(uint)(ABS(fVar188 * fVar162) <= ABS(fStack_16fc * fStack_16ec));
        auVar152._0_4_ = (uint)(fVar150 * fVar189 - fVar112 * fVar170) & uVar46;
        auVar152._4_4_ = (uint)(fVar158 * fVar190 - fVar117 * fVar176) & uVar49;
        auVar152._8_4_ = (uint)(fVar160 * fVar191 - fVar119 * fVar178) & uVar52;
        auVar152._12_4_ = (uint)(fVar162 * fVar192 - fVar121 * fVar180) & uVar55;
        auVar206._0_4_ = ~uVar46 & (uint)(local_16f8 * fVar170 - fVar150 * fVar124);
        auVar206._4_4_ = ~uVar49 & (uint)(fStack_16f4 * fVar176 - fVar158 * fVar134);
        auVar206._8_4_ = ~uVar52 & (uint)(fStack_16f0 * fVar178 - fVar160 * fVar136);
        auVar206._12_4_ = ~uVar55 & (uint)(fStack_16ec * fVar180 - fVar162 * fVar137);
        _local_1848 = auVar206 | auVar152;
        local_1838 = (float)(~uVar47 & (uint)(fVar124 * local_1708 - fVar111 * fVar170) |
                            (uint)(fVar182 * fVar170 - local_1708 * fVar189) & uVar47);
        fStack_1834 = (float)(~uVar50 & (uint)(fVar134 * fStack_1704 - fVar116 * fVar176) |
                             (uint)(fVar185 * fVar176 - fStack_1704 * fVar190) & uVar50);
        fStack_1830 = (float)(~uVar53 & (uint)(fVar136 * fStack_1700 - fVar118 * fVar178) |
                             (uint)(fVar187 * fVar178 - fStack_1700 * fVar191) & uVar53);
        fStack_182c = (float)(~uVar56 & (uint)(fVar137 * fStack_16fc - fVar120 * fVar180) |
                             (uint)(fVar188 * fVar180 - fStack_16fc * fVar192) & uVar56);
        local_1828 = (float)(~uVar48 & (uint)(fVar111 * fVar150 - local_1708 * local_16f8) |
                            (uint)(local_1708 * fVar112 - fVar182 * fVar150) & uVar48);
        fStack_1824 = (float)(~uVar51 & (uint)(fVar116 * fVar158 - fStack_1704 * fStack_16f4) |
                             (uint)(fStack_1704 * fVar117 - fVar185 * fVar158) & uVar51);
        fStack_1820 = (float)(~uVar54 & (uint)(fVar118 * fVar160 - fStack_1700 * fStack_16f0) |
                             (uint)(fStack_1700 * fVar119 - fVar187 * fVar160) & uVar54);
        fStack_181c = (float)(~uVar57 & (uint)(fVar120 * fVar162 - fStack_16fc * fStack_16ec) |
                             (uint)(fStack_16fc * fVar121 - fVar188 * fVar162) & uVar57);
        fVar198 = fVar90 * local_1848._0_4_ + fVar79 * local_1838 + local_19c8 * local_1828;
        fVar200 = fVar91 * local_1848._4_4_ + fVar80 * fStack_1834 + fStack_19c4 * fStack_1824;
        fVar201 = fVar101 * local_1848._8_4_ + fVar88 * fStack_1830 + fStack_19c0 * fStack_1820;
        fVar202 = fVar102 * local_1848._12_4_ + fVar89 * fStack_182c + fVar122 * fStack_181c;
        auVar128._0_4_ = fVar198 + fVar198;
        auVar128._4_4_ = fVar200 + fVar200;
        auVar128._8_4_ = fVar201 + fVar201;
        auVar128._12_4_ = fVar202 + fVar202;
        auVar97._0_4_ = fVar181 * local_1828;
        auVar97._4_4_ = fVar184 * fStack_1824;
        auVar97._8_4_ = fVar186 * fStack_1820;
        auVar97._12_4_ = fVar146 * fStack_181c;
        fVar200 = fVar123 * local_1848._0_4_ + fVar139 * local_1838 + auVar97._0_4_;
        fVar201 = fVar133 * local_1848._4_4_ + fVar145 * fStack_1834 + auVar97._4_4_;
        fVar202 = fVar135 * local_1848._8_4_ + fVar147 * fStack_1830 + auVar97._8_4_;
        fVar122 = fVar138 * local_1848._12_4_ + fVar144 * fStack_182c + auVar97._12_4_;
        auVar92 = rcpps(auVar97,auVar128);
        fVar138 = auVar92._0_4_;
        fVar144 = auVar92._4_4_;
        fVar146 = auVar92._8_4_;
        fVar198 = auVar92._12_4_;
        fVar200 = ((1.0 - auVar128._0_4_ * fVar138) * fVar138 + fVar138) * (fVar200 + fVar200);
        fVar201 = ((1.0 - auVar128._4_4_ * fVar144) * fVar144 + fVar144) * (fVar201 + fVar201);
        fVar202 = ((1.0 - auVar128._8_4_ * fVar146) * fVar146 + fVar146) * (fVar202 + fVar202);
        fVar122 = ((1.0 - auVar128._12_4_ * fVar198) * fVar198 + fVar198) * (fVar122 + fVar122);
        ppcVar2 = &(This->intersector4_nofilter).name;
        fVar138 = *(float *)ppcVar2;
        fVar144 = *(float *)((long)&(This->intersector4_nofilter).name + 4);
        fVar146 = *(float *)&(This->intersector8).intersect;
        fVar198 = *(float *)((long)&(This->intersector8).intersect + 4);
        auVar92 = *(undefined1 (*) [16])ppcVar2;
        bVar45 = *(float *)&(This->intersector1).pointQuery <= fVar200;
        bVar4 = *(float *)((long)&(This->intersector1).pointQuery + 4) <= fVar201;
        bVar5 = *(float *)&(This->intersector1).name <= fVar202;
        bVar6 = *(float *)((long)&(This->intersector1).name + 4) <= fVar122;
        auVar98._4_4_ = -(uint)bVar4;
        auVar98._0_4_ = -(uint)bVar45;
        auVar98._8_4_ = -(uint)bVar5;
        auVar98._12_4_ = -(uint)bVar6;
        auVar129._0_4_ =
             (int)((uint)(auVar128._0_4_ != 0.0 && (fVar200 <= fVar138 && bVar45)) * -0x80000000) >>
             0x1f;
        auVar129._4_4_ =
             (int)((uint)(auVar128._4_4_ != 0.0 && (fVar201 <= fVar144 && bVar4)) * -0x80000000) >>
             0x1f;
        auVar129._8_4_ =
             (int)((uint)(auVar128._8_4_ != 0.0 && (fVar202 <= fVar146 && bVar5)) * -0x80000000) >>
             0x1f;
        auVar129._12_4_ =
             (int)((uint)(auVar128._12_4_ != 0.0 && (fVar122 <= fVar198 && bVar6)) * -0x80000000) >>
             0x1f;
        iVar35 = movmskps(iVar35,auVar129 & auVar68);
        if (iVar35 != 0) {
          lVar3 = *(long *)(*(long *)(*(long *)ray + 0x1e8) + uVar32 * 8);
          uVar46 = *(uint *)(lVar3 + 0x34);
          auVar69._0_4_ = -(uint)((uVar46 & *(uint *)&(This->intersector8).occluded) == 0);
          auVar69._4_4_ =
               -(uint)((uVar46 & *(uint *)((long)&(This->intersector8).occluded + 4)) == 0);
          auVar69._8_4_ = -(uint)((uVar46 & *(uint *)&(This->intersector8).name) == 0);
          auVar69._12_4_ = -(uint)((uVar46 & *(uint *)((long)&(This->intersector8).name + 4)) == 0);
          local_1958 = ~auVar69 & auVar129 & auVar68;
          iVar35 = movmskps((int)*(long *)(*(long *)ray + 0x1e8),local_1958);
          if (iVar35 != 0) {
            local_17f8 = *(undefined4 *)((long)&local_1858 + uVar42 * 4);
            if ((*(long *)(*(long *)(ray + 0x10) + 0x10) != 0) || (*(long *)(lVar3 + 0x48) != 0)) {
              auVar26._4_4_ = fVar194;
              auVar26._0_4_ = fVar193;
              auVar26._8_4_ = fVar195;
              auVar26._12_4_ = fVar196;
              auVar125 = rcpps(auVar98,auVar26);
              fVar79 = auVar125._0_4_;
              fVar80 = auVar125._4_4_;
              fVar88 = auVar125._8_4_;
              fVar89 = auVar125._12_4_;
              fVar91 = (float)DAT_01f7ba10;
              fVar101 = DAT_01f7ba10._4_4_;
              fVar102 = DAT_01f7ba10._12_4_;
              fVar90 = DAT_01f7ba10._8_4_;
              fVar58 = (float)(-(uint)(1e-18 <= fVar58) &
                              (uint)((fVar91 - fVar193 * fVar79) * fVar79 + fVar79));
              fVar76 = (float)(-(uint)(1e-18 <= fVar76) &
                              (uint)((fVar101 - fVar194 * fVar80) * fVar80 + fVar80));
              fVar77 = (float)(-(uint)(1e-18 <= fVar77) &
                              (uint)((fVar90 - fVar195 * fVar88) * fVar88 + fVar88));
              fVar78 = (float)(-(uint)(1e-18 <= fVar78) &
                              (uint)((fVar102 - fVar196 * fVar89) * fVar89 + fVar89));
              auVar153._0_4_ = fVar163 * fVar58;
              auVar153._4_4_ = fVar167 * fVar76;
              auVar153._8_4_ = fStack_1930 * fVar77;
              auVar153._12_4_ = register0x0000140c * fVar78;
              auVar125 = minps(auVar153,_DAT_01f7ba10);
              auVar172._0_4_ = (float)local_1908._0_4_ * fVar58;
              auVar172._4_4_ = (float)local_1908._4_4_ * fVar76;
              auVar172._8_4_ = fStack_1900 * fVar77;
              auVar172._12_4_ = fStack_18fc * fVar78;
              auVar174 = minps(auVar172,_DAT_01f7ba10);
              auVar99._0_4_ = (uint)(fVar91 - auVar125._0_4_) & local_1788._0_4_;
              auVar99._4_4_ = (uint)(fVar101 - auVar125._4_4_) & local_1788._4_4_;
              auVar99._8_4_ = (uint)(fVar90 - auVar125._8_4_) & local_1788._8_4_;
              auVar99._12_4_ = (uint)(fVar102 - auVar125._12_4_) & local_1788._12_4_;
              auVar154._0_4_ = (uint)auVar125._0_4_ & local_1798._0_4_;
              auVar154._4_4_ = (uint)auVar125._4_4_ & local_1798._4_4_;
              auVar154._8_4_ = (uint)auVar125._8_4_ & local_1798._8_4_;
              auVar154._12_4_ = (uint)auVar125._12_4_ & local_1798._12_4_;
              local_1818 = auVar154 | auVar99;
              local_1808 = (uint)auVar174._0_4_ & local_1798._0_4_ |
                           (uint)(fVar91 - auVar174._0_4_) & local_1788._0_4_;
              uStack_1804 = (uint)auVar174._4_4_ & local_1798._4_4_ |
                            (uint)(fVar101 - auVar174._4_4_) & local_1788._4_4_;
              uStack_1800 = (uint)auVar174._8_4_ & local_1798._8_4_ |
                            (uint)(fVar90 - auVar174._8_4_) & local_1788._8_4_;
              uStack_17fc = (uint)auVar174._12_4_ & local_1798._12_4_ |
                            (uint)(fVar102 - auVar174._12_4_) & local_1788._12_4_;
              uStack_17f4 = local_17f8;
              uStack_17f0 = local_17f8;
              uStack_17ec = local_17f8;
              uStack_17e4 = local_17e8;
              uStack_17e0 = local_17e8;
              uStack_17dc = local_17e8;
              local_17d8 = **(undefined4 **)(ray + 8);
              uStack_17d4 = local_17d8;
              uStack_17d0 = local_17d8;
              uStack_17cc = local_17d8;
              local_17c8 = (*(undefined4 **)(ray + 8))[1];
              uStack_17c4 = local_17c8;
              uStack_17c0 = local_17c8;
              uStack_17bc = local_17c8;
              auVar86._0_4_ = (uint)fVar200 & local_1958._0_4_;
              auVar86._4_4_ = (uint)fVar201 & local_1958._4_4_;
              auVar86._8_4_ = (uint)fVar202 & local_1958._8_4_;
              auVar86._12_4_ = (uint)fVar122 & local_1958._12_4_;
              auVar100._0_4_ = ~local_1958._0_4_ & (uint)fVar138;
              auVar100._4_4_ = ~local_1958._4_4_ & (uint)fVar144;
              auVar100._8_4_ = ~local_1958._8_4_ & (uint)fVar146;
              auVar100._12_4_ = ~local_1958._12_4_ & (uint)fVar198;
              *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar100 | auVar86;
              args.valid = (int *)local_1958;
              args.geometryUserPtr = *(void **)(lVar3 + 0x18);
              args.context = *(RTCRayQueryContext **)(ray + 8);
              args.hit = (RTCHitN *)local_1848;
              args.N = 4;
              pcVar34 = *(code **)(lVar3 + 0x48);
              if (pcVar34 != (code *)0x0) {
                pcVar34 = (code *)(*pcVar34)(&args);
              }
              auVar87._0_4_ = -(uint)(local_1958._0_4_ == 0);
              auVar87._4_4_ = -(uint)(local_1958._4_4_ == 0);
              auVar87._8_4_ = -(uint)(local_1958._8_4_ == 0);
              auVar87._12_4_ = -(uint)(local_1958._12_4_ == 0);
              uVar46 = movmskps((int)pcVar34,auVar87);
              pRVar33 = (RTCRayN *)(ulong)(uVar46 ^ 0xf);
              if ((uVar46 ^ 0xf) == 0) {
                auVar87 = auVar87 ^ _DAT_01f7ae20;
                aVar199 = _DAT_01f7a9f0;
              }
              else {
                pcVar34 = *(code **)(*(byte **)(ray + 0x10) + 0x10);
                if ((pcVar34 != (code *)0x0) &&
                   (((**(byte **)(ray + 0x10) & 2) != 0 || ((*(byte *)(lVar3 + 0x3e) & 0x40) != 0)))
                   ) {
                  (*pcVar34)(&args);
                }
                aVar199 = _DAT_01f7a9f0;
                auVar73._0_4_ = -(uint)(local_1958._0_4_ == 0);
                auVar73._4_4_ = -(uint)(local_1958._4_4_ == 0);
                auVar73._8_4_ = -(uint)(local_1958._8_4_ == 0);
                auVar73._12_4_ = -(uint)(local_1958._12_4_ == 0);
                auVar87 = auVar73 ^ _DAT_01f7ae20;
                *(undefined1 (*) [16])(args.ray + 0x80) =
                     ~auVar73 & _DAT_01f7aa00 | *(undefined1 (*) [16])(args.ray + 0x80) & auVar73;
                pRVar33 = args.ray;
              }
              local_17e8 = (uint)pRVar33;
              local_1958._0_4_ = (auVar87._0_4_ << 0x1f) >> 0x1f;
              local_1958._4_4_ = (auVar87._4_4_ << 0x1f) >> 0x1f;
              local_1958._8_4_ = (auVar87._8_4_ << 0x1f) >> 0x1f;
              local_1958._12_4_ = (auVar87._12_4_ << 0x1f) >> 0x1f;
              *(undefined1 (*) [16])&(This->intersector4_nofilter).name =
                   *(undefined1 (*) [16])&(This->intersector4_nofilter).name & local_1958 |
                   ~local_1958 & auVar92;
            }
            auVar59 = ~local_1958 & auVar59;
          }
        }
      }
      uVar46 = movmskps(local_17e8,auVar59);
      uVar32 = (ulong)uVar46;
      if (uVar46 == 0) break;
      fVar138 = *(float *)&This->ptr;
      fVar144 = *(float *)((long)&This->ptr + 4);
      fVar146 = *(float *)&This->leafIntersector;
      fVar58 = *(float *)((long)&This->leafIntersector + 4);
      fVar76 = *(float *)&(This->collider).collide;
      fVar77 = *(float *)((long)&(This->collider).collide + 4);
      fVar78 = *(float *)&(This->collider).name;
      fVar193 = *(float *)((long)&(This->collider).name + 4);
      fVar194 = *(float *)&(This->intersector1).intersect;
      fVar195 = *(float *)((long)&(This->intersector1).intersect + 4);
      fVar196 = *(float *)&(This->intersector1).occluded;
      fVar198 = *(float *)((long)&(This->intersector1).occluded + 4);
      p_Var21 = (This->intersector4).intersect;
      p_Var22 = (This->intersector4).occluded;
      pcVar23 = (This->intersector4).name;
      p_Var24 = (This->intersector4_filter).intersect;
      fVar160 = fVar148 - fVar138;
      fVar162 = fVar148 - fVar144;
      fVar163 = fVar148 - fVar146;
      fVar148 = fVar148 - fVar58;
      fVar147 = fVar168 - fVar76;
      fVar150 = fVar168 - fVar77;
      fVar158 = fVar168 - fVar78;
      fVar168 = fVar168 - fVar193;
      fVar176 = fVar197 - fVar194;
      fVar178 = fVar197 - fVar195;
      fVar180 = fVar197 - fVar196;
      fVar197 = fVar197 - fVar198;
      fVar184 = local_1758 - fVar138;
      fVar185 = fStack_1754 - fVar144;
      fVar186 = fStack_1750 - fVar146;
      fVar187 = fStack_174c - fVar58;
      fVar188 = local_1748 - fVar76;
      fVar190 = fStack_1744 - fVar77;
      fVar192 = fStack_1740 - fVar78;
      fVar204 = fStack_173c - fVar193;
      fVar80 = (float)local_1928._0_4_ - fVar194;
      fVar88 = (float)local_1928._4_4_ - fVar195;
      fVar89 = fStack_1920 - fVar196;
      fVar90 = fStack_191c - fVar198;
      fVar138 = local_1718 - fVar138;
      fVar144 = fStack_1714 - fVar144;
      fVar146 = fStack_1710 - fVar146;
      fVar58 = fStack_170c - fVar58;
      fVar76 = local_1738 - fVar76;
      fVar77 = fStack_1734 - fVar77;
      fVar78 = fStack_1730 - fVar78;
      fVar193 = fStack_172c - fVar193;
      fVar194 = local_1728 - fVar194;
      fVar195 = fStack_1724 - fVar195;
      fVar196 = fStack_1720 - fVar196;
      fVar198 = fStack_171c - fVar198;
      local_1908._0_4_ = fVar138 - fVar160;
      local_1908._4_4_ = fVar144 - fVar162;
      fStack_1900 = fVar146 - fVar163;
      fStack_18fc = fVar58 - fVar148;
      fVar167 = fVar76 - fVar147;
      fVar169 = fVar77 - fVar150;
      fVar170 = fVar78 - fVar158;
      fVar175 = fVar193 - fVar168;
      fVar119 = fVar194 - fVar176;
      fVar121 = fVar195 - fVar178;
      fVar124 = fVar196 - fVar180;
      fVar134 = fVar198 - fVar197;
      pp_Var1 = &(This->intersector4_filter).occluded;
      auVar27 = *(undefined1 (*) [12])pp_Var1;
      fVar200 = *(float *)((long)&(This->intersector4_filter).name + 4);
      auVar28._0_8_ = (This->intersector4_filter).occluded;
      auVar28._8_8_ = (This->intersector4_filter).name;
      fVar201 = fVar160 - fVar184;
      fVar202 = fVar162 - fVar185;
      fVar122 = fVar163 - fVar186;
      fVar79 = fVar148 - fVar187;
      local_19c8 = SUB84(pcVar23,0);
      fStack_19c4 = (float)((ulong)pcVar23 >> 0x20);
      fStack_19c0 = SUB84(p_Var24,0);
      fStack_19bc = (float)((ulong)p_Var24 >> 0x20);
      fVar136 = fVar147 - fVar188;
      fVar137 = fVar150 - fVar190;
      fVar139 = fVar158 - fVar192;
      fVar145 = fVar168 - fVar204;
      local_19b8 = SUB84(p_Var21,0);
      fStack_19b4 = (float)((ulong)p_Var21 >> 0x20);
      fStack_19b0 = SUB84(p_Var22,0);
      fStack_19ac = (float)((ulong)p_Var22 >> 0x20);
      fVar209 = (fVar167 * (fVar194 + fVar176) - (fVar76 + fVar147) * fVar119) * local_19b8 +
                ((fVar138 + fVar160) * fVar119 - (fVar194 + fVar176) * (float)local_1908._0_4_) *
                local_19c8 +
                ((float)local_1908._0_4_ * (fVar76 + fVar147) - (fVar138 + fVar160) * fVar167) *
                *(float *)pp_Var1;
      fVar210 = (fVar169 * (fVar195 + fVar178) - (fVar77 + fVar150) * fVar121) * fStack_19b4 +
                ((fVar144 + fVar162) * fVar121 - (fVar195 + fVar178) * (float)local_1908._4_4_) *
                fStack_19c4 +
                ((float)local_1908._4_4_ * (fVar77 + fVar150) - (fVar144 + fVar162) * fVar169) *
                *(float *)((long)&(This->intersector4_filter).occluded + 4);
      local_1928 = (undefined1  [8])CONCAT44(fVar210,fVar209);
      fStack_1920 = (fVar170 * (fVar196 + fVar180) - (fVar78 + fVar158) * fVar124) * fStack_19b0 +
                    ((fVar146 + fVar163) * fVar124 - (fVar196 + fVar180) * fStack_1900) *
                    fStack_19c0 +
                    (fStack_1900 * (fVar78 + fVar158) - (fVar146 + fVar163) * fVar170) *
                    *(float *)&(This->intersector4_filter).name;
      fStack_191c = (fVar175 * (fVar198 + fVar197) - (fVar193 + fVar168) * fVar134) * fStack_19ac +
                    ((fVar58 + fVar148) * fVar134 - (fVar198 + fVar197) * fStack_18fc) * fStack_19bc
                    + (fStack_18fc * (fVar193 + fVar168) - (fVar58 + fVar148) * fVar175) * fVar200;
      fVar91 = fVar176 - fVar80;
      fVar101 = fVar178 - fVar88;
      fVar102 = fVar180 - fVar89;
      fVar111 = fVar197 - fVar90;
      local_1938._0_4_ = auVar27._0_4_;
      local_1938._4_4_ = auVar27._4_4_;
      fStack_1930 = auVar27._8_4_;
      fVar177 = (fVar136 * (fVar176 + fVar80) - (fVar147 + fVar188) * fVar91) * local_19b8 +
                ((fVar160 + fVar184) * fVar91 - (fVar176 + fVar80) * fVar201) * local_19c8 +
                (fVar201 * (fVar147 + fVar188) - (fVar160 + fVar184) * fVar136) *
                (float)local_1938._0_4_;
      fVar179 = (fVar137 * (fVar178 + fVar88) - (fVar150 + fVar190) * fVar101) * fStack_19b4 +
                ((fVar162 + fVar185) * fVar101 - (fVar178 + fVar88) * fVar202) * fStack_19c4 +
                (fVar202 * (fVar150 + fVar190) - (fVar162 + fVar185) * fVar137) *
                (float)local_1938._4_4_;
      fVar181 = (fVar139 * (fVar180 + fVar89) - (fVar158 + fVar192) * fVar102) * fStack_19b0 +
                ((fVar163 + fVar186) * fVar102 - (fVar180 + fVar89) * fVar122) * fStack_19c0 +
                (fVar122 * (fVar158 + fVar192) - (fVar163 + fVar186) * fVar139) * fStack_1930;
      fVar182 = (fVar145 * (fVar197 + fVar90) - (fVar168 + fVar204) * fVar111) * fStack_19ac +
                ((fVar148 + fVar187) * fVar111 - (fVar197 + fVar90) * fVar79) * fStack_19bc +
                (fVar79 * (fVar168 + fVar204) - (fVar148 + fVar187) * fVar145) * fVar200;
      fVar112 = fVar184 - fVar138;
      fVar116 = fVar185 - fVar144;
      fVar117 = fVar186 - fVar146;
      fVar118 = fVar187 - fVar58;
      fVar120 = fVar188 - fVar76;
      fVar123 = fVar190 - fVar77;
      fVar133 = fVar192 - fVar78;
      fVar135 = fVar204 - fVar193;
      fVar189 = fVar80 - fVar194;
      fVar191 = fVar88 - fVar195;
      fVar203 = fVar89 - fVar196;
      fVar208 = fVar90 - fVar198;
      auVar166._0_4_ =
           (fVar120 * (fVar194 + fVar80) - (fVar76 + fVar188) * fVar189) * local_19b8 +
           ((fVar138 + fVar184) * fVar189 - (fVar194 + fVar80) * fVar112) * local_19c8 +
           (fVar112 * (fVar76 + fVar188) - (fVar138 + fVar184) * fVar120) * (float)local_1938._0_4_;
      auVar166._4_4_ =
           (fVar123 * (fVar195 + fVar88) - (fVar77 + fVar190) * fVar191) * fStack_19b4 +
           ((fVar144 + fVar185) * fVar191 - (fVar195 + fVar88) * fVar116) * fStack_19c4 +
           (fVar116 * (fVar77 + fVar190) - (fVar144 + fVar185) * fVar123) * (float)local_1938._4_4_;
      auVar166._8_4_ =
           (fVar133 * (fVar196 + fVar89) - (fVar78 + fVar192) * fVar203) * fStack_19b0 +
           ((fVar146 + fVar186) * fVar203 - (fVar196 + fVar89) * fVar117) * fStack_19c0 +
           (fVar117 * (fVar78 + fVar192) - (fVar146 + fVar186) * fVar133) * fStack_1930;
      auVar166._12_4_ =
           (fVar135 * (fVar198 + fVar90) - (fVar193 + fVar204) * fVar208) * fStack_19ac +
           ((fVar58 + fVar187) * fVar208 - (fVar198 + fVar90) * fVar118) * fStack_19bc +
           (fVar118 * (fVar193 + fVar204) - (fVar58 + fVar187) * fVar135) * fVar200;
      auVar130._0_4_ = fVar209 + fVar177 + auVar166._0_4_;
      auVar130._4_4_ = fVar210 + fVar179 + auVar166._4_4_;
      auVar130._8_4_ = fStack_1920 + fVar181 + auVar166._8_4_;
      auVar130._12_4_ = fStack_191c + fVar182 + auVar166._12_4_;
      auVar183._8_4_ = fStack_1920;
      auVar183._0_8_ = local_1928;
      auVar183._12_4_ = fStack_191c;
      auVar7._4_4_ = fVar179;
      auVar7._0_4_ = fVar177;
      auVar7._8_4_ = fVar181;
      auVar7._12_4_ = fVar182;
      auVar92 = minps(auVar183,auVar7);
      auVar92 = minps(auVar92,auVar166);
      auVar8._4_4_ = fVar179;
      auVar8._0_4_ = fVar177;
      auVar8._8_4_ = fVar181;
      auVar8._12_4_ = fVar182;
      auVar125 = maxps(_local_1928,auVar8);
      auVar125 = maxps(auVar125,auVar166);
      uVar47 = (uint)DAT_01f7b6c0;
      uVar48 = DAT_01f7b6c0._4_4_;
      uVar49 = DAT_01f7b6c0._8_4_;
      uVar50 = DAT_01f7b6c0._12_4_;
      fVar138 = (float)((uint)auVar130._0_4_ & uVar47) * 1.1920929e-07;
      fVar144 = (float)((uint)auVar130._4_4_ & uVar48) * 1.1920929e-07;
      fVar146 = (float)((uint)auVar130._8_4_ & uVar49) * 1.1920929e-07;
      fVar58 = (float)((uint)auVar130._12_4_ & uVar50) * 1.1920929e-07;
      local_1a48 = auVar59._0_4_;
      uStack_1a44 = auVar59._4_4_;
      uStack_1a40 = auVar59._8_4_;
      uStack_1a3c = auVar59._12_4_;
      auVar207._0_4_ = -(uint)(auVar125._0_4_ <= fVar138 || -fVar138 <= auVar92._0_4_) & local_1a48;
      auVar207._4_4_ = -(uint)(auVar125._4_4_ <= fVar144 || -fVar144 <= auVar92._4_4_) & uStack_1a44
      ;
      auVar207._8_4_ = -(uint)(auVar125._8_4_ <= fVar146 || -fVar146 <= auVar92._8_4_) & uStack_1a40
      ;
      auVar207._12_4_ =
           -(uint)(auVar125._12_4_ <= fVar58 || -fVar58 <= auVar92._12_4_) & uStack_1a3c;
      local_17e8 = movmskps(uVar46,auVar207);
      aVar199 = _DAT_01f7a9f0;
      if (local_17e8 != 0) {
        uVar46 = -(uint)((float)((uint)(fVar120 * fVar91) & uVar47) <=
                        (float)((uint)(fVar136 * fVar119) & uVar47));
        uVar53 = -(uint)((float)((uint)(fVar123 * fVar101) & uVar48) <=
                        (float)((uint)(fVar137 * fVar121) & uVar48));
        uVar56 = -(uint)((float)((uint)(fVar133 * fVar102) & uVar49) <=
                        (float)((uint)(fVar139 * fVar124) & uVar49));
        uVar108 = -(uint)((float)((uint)(fVar135 * fVar111) & uVar50) <=
                         (float)((uint)(fVar145 * fVar134) & uVar50));
        uVar51 = -(uint)((float)((uint)(fVar201 * fVar189) & uVar47) <=
                        (float)((uint)((float)local_1908._0_4_ * fVar91) & uVar47));
        uVar54 = -(uint)((float)((uint)(fVar202 * fVar191) & uVar48) <=
                        (float)((uint)((float)local_1908._4_4_ * fVar101) & uVar48));
        uVar57 = -(uint)((float)((uint)(fVar122 * fVar203) & uVar49) <=
                        (float)((uint)(fStack_1900 * fVar102) & uVar49));
        uVar109 = -(uint)((float)((uint)(fVar79 * fVar208) & uVar50) <=
                         (float)((uint)(fStack_18fc * fVar111) & uVar50));
        uVar52 = -(uint)((float)((uint)(fVar112 * fVar136) & uVar47) <=
                        (float)((uint)(fVar201 * fVar167) & uVar47));
        uVar55 = -(uint)((float)((uint)(fVar116 * fVar137) & uVar48) <=
                        (float)((uint)(fVar202 * fVar169) & uVar48));
        uVar103 = -(uint)((float)((uint)(fVar117 * fVar139) & uVar49) <=
                         (float)((uint)(fVar122 * fVar170) & uVar49));
        uVar110 = -(uint)((float)((uint)(fVar118 * fVar145) & uVar50) <=
                         (float)((uint)(fVar79 * fVar175) & uVar50));
        local_1848._0_4_ =
             ~uVar46 & (uint)(fVar167 * fVar91 - fVar136 * fVar119) |
             (uint)(fVar136 * fVar189 - fVar120 * fVar91) & uVar46;
        local_1848._4_4_ =
             ~uVar53 & (uint)(fVar169 * fVar101 - fVar137 * fVar121) |
             (uint)(fVar137 * fVar191 - fVar123 * fVar101) & uVar53;
        fStack_1840 = (float)(~uVar56 & (uint)(fVar170 * fVar102 - fVar139 * fVar124) |
                             (uint)(fVar139 * fVar203 - fVar133 * fVar102) & uVar56);
        fStack_183c = (float)(~uVar108 & (uint)(fVar175 * fVar111 - fVar145 * fVar134) |
                             (uint)(fVar145 * fVar208 - fVar135 * fVar111) & uVar108);
        local_1838 = (float)(~uVar51 & (uint)(fVar119 * fVar201 - (float)local_1908._0_4_ * fVar91)
                            | (uint)(fVar112 * fVar91 - fVar201 * fVar189) & uVar51);
        fStack_1834 = (float)(~uVar54 & (uint)(fVar121 * fVar202 - (float)local_1908._4_4_ * fVar101
                                              ) |
                             (uint)(fVar116 * fVar101 - fVar202 * fVar191) & uVar54);
        fStack_1830 = (float)(~uVar57 & (uint)(fVar124 * fVar122 - fStack_1900 * fVar102) |
                             (uint)(fVar117 * fVar102 - fVar122 * fVar203) & uVar57);
        fStack_182c = (float)(~uVar109 & (uint)(fVar134 * fVar79 - fStack_18fc * fVar111) |
                             (uint)(fVar118 * fVar111 - fVar79 * fVar208) & uVar109);
        local_1828 = (float)(~uVar52 & (uint)((float)local_1908._0_4_ * fVar136 - fVar201 * fVar167)
                            | (uint)(fVar201 * fVar120 - fVar112 * fVar136) & uVar52);
        fStack_1824 = (float)(~uVar55 & (uint)((float)local_1908._4_4_ * fVar137 - fVar202 * fVar169
                                              ) |
                             (uint)(fVar202 * fVar123 - fVar116 * fVar137) & uVar55);
        fStack_1820 = (float)(~uVar103 & (uint)(fStack_1900 * fVar139 - fVar122 * fVar170) |
                             (uint)(fVar122 * fVar133 - fVar117 * fVar139) & uVar103);
        fStack_181c = (float)(~uVar110 & (uint)(fStack_18fc * fVar145 - fVar79 * fVar175) |
                             (uint)(fVar79 * fVar135 - fVar118 * fVar145) & uVar110);
        fVar138 = local_19b8 * (float)local_1848._0_4_ +
                  local_19c8 * local_1838 + (float)local_1938._0_4_ * local_1828;
        fVar144 = fStack_19b4 * (float)local_1848._4_4_ +
                  fStack_19c4 * fStack_1834 + (float)local_1938._4_4_ * fStack_1824;
        fVar146 = fStack_19b0 * fStack_1840 + fStack_19c0 * fStack_1830 + fStack_1930 * fStack_1820;
        fVar58 = fStack_19ac * fStack_183c + fStack_19bc * fStack_182c + fVar200 * fStack_181c;
        auVar131._0_4_ = fVar138 + fVar138;
        auVar131._4_4_ = fVar144 + fVar144;
        auVar131._8_4_ = fVar146 + fVar146;
        auVar131._12_4_ = fVar58 + fVar58;
        auVar70._0_4_ = fVar176 * local_1828;
        auVar70._4_4_ = fVar178 * fStack_1824;
        auVar70._8_4_ = fVar180 * fStack_1820;
        auVar70._12_4_ = fVar197 * fStack_181c;
        fVar197 = fVar160 * (float)local_1848._0_4_ + fVar147 * local_1838 + auVar70._0_4_;
        fVar58 = fVar162 * (float)local_1848._4_4_ + fVar150 * fStack_1834 + auVar70._4_4_;
        fVar76 = fVar163 * fStack_1840 + fVar158 * fStack_1830 + auVar70._8_4_;
        fVar168 = fVar148 * fStack_183c + fVar168 * fStack_182c + auVar70._12_4_;
        auVar92 = rcpps(auVar70,auVar131);
        fVar138 = auVar92._0_4_;
        fVar144 = auVar92._4_4_;
        fVar146 = auVar92._8_4_;
        fVar148 = auVar92._12_4_;
        fVar138 = ((1.0 - auVar131._0_4_ * fVar138) * fVar138 + fVar138) * (fVar197 + fVar197);
        fVar144 = ((1.0 - auVar131._4_4_ * fVar144) * fVar144 + fVar144) * (fVar58 + fVar58);
        fVar146 = ((1.0 - auVar131._8_4_ * fVar146) * fVar146 + fVar146) * (fVar76 + fVar76);
        fVar148 = ((1.0 - auVar131._12_4_ * fVar148) * fVar148 + fVar148) * (fVar168 + fVar168);
        auVar92 = *(undefined1 (*) [16])&(This->intersector4_nofilter).name;
        auVar132._0_4_ =
             (int)((uint)(auVar131._0_4_ != 0.0 &&
                         (fVar138 <= auVar92._0_4_ &&
                         *(float *)&(This->intersector1).pointQuery <= fVar138)) * -0x80000000) >>
             0x1f;
        auVar132._4_4_ =
             (int)((uint)(auVar131._4_4_ != 0.0 &&
                         (fVar144 <= auVar92._4_4_ &&
                         *(float *)((long)&(This->intersector1).pointQuery + 4) <= fVar144)) *
                  -0x80000000) >> 0x1f;
        auVar132._8_4_ =
             (int)((uint)(auVar131._8_4_ != 0.0 &&
                         (fVar146 <= auVar92._8_4_ &&
                         *(float *)&(This->intersector1).name <= fVar146)) * -0x80000000) >> 0x1f;
        auVar132._12_4_ =
             (int)((uint)(auVar131._12_4_ != 0.0 &&
                         (fVar148 <= auVar92._12_4_ &&
                         *(float *)((long)&(This->intersector1).name + 4) <= fVar148)) * -0x80000000
                  ) >> 0x1f;
        local_17e8 = movmskps(local_17e8,auVar132 & auVar207);
        if (local_17e8 != 0) {
          local_17e8 = *(uint *)(lVar39 + uVar42 * 4);
          lVar3 = *(long *)(*(long *)(*(long *)ray + 0x1e8) + (ulong)local_17e8 * 8);
          uVar46 = *(uint *)(lVar3 + 0x34);
          auVar106._0_4_ = -(uint)((uVar46 & *(uint *)&(This->intersector8).occluded) == 0);
          auVar106._4_4_ =
               -(uint)((uVar46 & *(uint *)((long)&(This->intersector8).occluded + 4)) == 0);
          auVar106._8_4_ = -(uint)((uVar46 & *(uint *)&(This->intersector8).name) == 0);
          auVar106._12_4_ = -(uint)((uVar46 & *(uint *)((long)&(This->intersector8).name + 4)) == 0)
          ;
          local_1958 = ~auVar106 & auVar132 & auVar207;
          iVar35 = movmskps((int)*(long *)(*(long *)ray + 0x1e8),local_1958);
          if (iVar35 != 0) {
            local_17f8 = *(undefined4 *)((long)&local_1858 + uVar42 * 4);
            if ((*(long *)(*(long *)(ray + 0x10) + 0x10) != 0) || (*(long *)(lVar3 + 0x48) != 0)) {
              auVar125 = rcpps(local_1948,auVar130);
              fVar168 = auVar125._0_4_;
              fVar197 = auVar125._4_4_;
              fVar58 = auVar125._8_4_;
              fVar76 = auVar125._12_4_;
              fVar78 = (float)DAT_01f7ba10;
              fVar193 = DAT_01f7ba10._4_4_;
              fVar194 = DAT_01f7ba10._12_4_;
              fVar77 = DAT_01f7ba10._8_4_;
              fVar168 = (float)(-(uint)(1e-18 <= (float)((uint)auVar130._0_4_ & uVar47)) &
                               (uint)((fVar78 - auVar130._0_4_ * fVar168) * fVar168 + fVar168));
              fVar197 = (float)(-(uint)(1e-18 <= (float)((uint)auVar130._4_4_ & uVar48)) &
                               (uint)((fVar193 - auVar130._4_4_ * fVar197) * fVar197 + fVar197));
              fVar58 = (float)(-(uint)(1e-18 <= (float)((uint)auVar130._8_4_ & uVar49)) &
                              (uint)((fVar77 - auVar130._8_4_ * fVar58) * fVar58 + fVar58));
              fVar76 = (float)(-(uint)(1e-18 <= (float)((uint)auVar130._12_4_ & uVar50)) &
                              (uint)((fVar194 - auVar130._12_4_ * fVar76) * fVar76 + fVar76));
              auVar155._0_4_ = fVar209 * fVar168;
              auVar155._4_4_ = fVar210 * fVar197;
              auVar155._8_4_ = fStack_1920 * fVar58;
              auVar155._12_4_ = fStack_191c * fVar76;
              auVar125 = minps(auVar155,_DAT_01f7ba10);
              auVar173._0_4_ = fVar177 * fVar168;
              auVar173._4_4_ = fVar179 * fVar197;
              auVar173._8_4_ = fVar181 * fVar58;
              auVar173._12_4_ = fVar182 * fVar76;
              auVar174 = minps(auVar173,_DAT_01f7ba10);
              auVar71._0_4_ = (uint)(fVar78 - auVar125._0_4_) & local_17a8._0_4_;
              auVar71._4_4_ = (uint)(fVar193 - auVar125._4_4_) & local_17a8._4_4_;
              auVar71._8_4_ = (uint)(fVar77 - auVar125._8_4_) & local_17a8._8_4_;
              auVar71._12_4_ = (uint)(fVar194 - auVar125._12_4_) & local_17a8._12_4_;
              auVar156._0_4_ = (uint)auVar125._0_4_ & local_17b8._0_4_;
              auVar156._4_4_ = (uint)auVar125._4_4_ & local_17b8._4_4_;
              auVar156._8_4_ = (uint)auVar125._8_4_ & local_17b8._8_4_;
              auVar156._12_4_ = (uint)auVar125._12_4_ & local_17b8._12_4_;
              local_1818 = auVar156 | auVar71;
              local_1808 = (uint)auVar174._0_4_ & local_17b8._0_4_ |
                           (uint)(fVar78 - auVar174._0_4_) & local_17a8._0_4_;
              uStack_1804 = (uint)auVar174._4_4_ & local_17b8._4_4_ |
                            (uint)(fVar193 - auVar174._4_4_) & local_17a8._4_4_;
              uStack_1800 = (uint)auVar174._8_4_ & local_17b8._8_4_ |
                            (uint)(fVar77 - auVar174._8_4_) & local_17a8._8_4_;
              uStack_17fc = (uint)auVar174._12_4_ & local_17b8._12_4_ |
                            (uint)(fVar194 - auVar174._12_4_) & local_17a8._12_4_;
              uStack_17f4 = local_17f8;
              uStack_17f0 = local_17f8;
              uStack_17ec = local_17f8;
              uStack_17e4 = local_17e8;
              uStack_17e0 = local_17e8;
              uStack_17dc = local_17e8;
              local_17d8 = **(undefined4 **)(ray + 8);
              uStack_17d4 = local_17d8;
              uStack_17d0 = local_17d8;
              uStack_17cc = local_17d8;
              local_17c8 = (*(undefined4 **)(ray + 8))[1];
              uStack_17c4 = local_17c8;
              uStack_17c0 = local_17c8;
              uStack_17bc = local_17c8;
              auVar115._0_4_ = (uint)fVar138 & local_1958._0_4_;
              auVar115._4_4_ = (uint)fVar144 & local_1958._4_4_;
              auVar115._8_4_ = (uint)fVar146 & local_1958._8_4_;
              auVar115._12_4_ = (uint)fVar148 & local_1958._12_4_;
              auVar72._0_4_ = ~local_1958._0_4_ & (uint)auVar92._0_4_;
              auVar72._4_4_ = ~local_1958._4_4_ & (uint)auVar92._4_4_;
              auVar72._8_4_ = ~local_1958._8_4_ & (uint)auVar92._8_4_;
              auVar72._12_4_ = ~local_1958._12_4_ & (uint)auVar92._12_4_;
              *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar72 | auVar115;
              args.valid = (int *)local_1958;
              args.geometryUserPtr = *(void **)(lVar3 + 0x18);
              args.context = *(RTCRayQueryContext **)(ray + 8);
              args.hit = (RTCHitN *)local_1848;
              args.N = 4;
              pcVar34 = *(code **)(lVar3 + 0x48);
              _local_1938 = auVar28;
              args.ray = (RTCRayN *)This;
              if (pcVar34 != (code *)0x0) {
                pcVar34 = (code *)(*pcVar34)(&args);
              }
              auVar74._0_4_ = -(uint)(local_1958._0_4_ == 0);
              auVar74._4_4_ = -(uint)(local_1958._4_4_ == 0);
              auVar74._8_4_ = -(uint)(local_1958._8_4_ == 0);
              auVar74._12_4_ = -(uint)(local_1958._12_4_ == 0);
              uVar46 = movmskps((int)pcVar34,auVar74);
              pRVar33 = (RTCRayN *)(ulong)(uVar46 ^ 0xf);
              if ((uVar46 ^ 0xf) == 0) {
                auVar74 = auVar74 ^ _DAT_01f7ae20;
                aVar199 = _DAT_01f7a9f0;
              }
              else {
                pcVar34 = *(code **)(*(byte **)(ray + 0x10) + 0x10);
                if ((pcVar34 != (code *)0x0) &&
                   (((**(byte **)(ray + 0x10) & 2) != 0 || ((*(byte *)(lVar3 + 0x3e) & 0x40) != 0)))
                   ) {
                  (*pcVar34)(&args);
                }
                aVar199 = _DAT_01f7a9f0;
                auVar107._0_4_ = -(uint)(local_1958._0_4_ == 0);
                auVar107._4_4_ = -(uint)(local_1958._4_4_ == 0);
                auVar107._8_4_ = -(uint)(local_1958._8_4_ == 0);
                auVar107._12_4_ = -(uint)(local_1958._12_4_ == 0);
                auVar74 = auVar107 ^ _DAT_01f7ae20;
                *(undefined1 (*) [16])(args.ray + 0x80) =
                     ~auVar107 & _DAT_01f7aa00 | *(undefined1 (*) [16])(args.ray + 0x80) & auVar107;
                pRVar33 = args.ray;
              }
              local_17e8 = (uint)pRVar33;
              local_1958._0_4_ = (auVar74._0_4_ << 0x1f) >> 0x1f;
              local_1958._4_4_ = (auVar74._4_4_ << 0x1f) >> 0x1f;
              local_1958._8_4_ = (auVar74._8_4_ << 0x1f) >> 0x1f;
              local_1958._12_4_ = (auVar74._12_4_ << 0x1f) >> 0x1f;
              *(undefined1 (*) [16])&(This->intersector4_nofilter).name =
                   *(undefined1 (*) [16])&(This->intersector4_nofilter).name & local_1958 |
                   ~local_1958 & auVar92;
            }
            auVar59 = ~local_1958 & auVar59;
          }
        }
      }
      uVar46 = movmskps(local_17e8,auVar59);
      uVar32 = (ulong)uVar46;
      if ((uVar46 == 0) || (uVar32 = uVar42 + 1, bVar45 = 2 < uVar42, uVar42 = uVar32, bVar45))
      break;
    }
    auVar65._0_4_ = local_1948._0_4_ & auVar59._0_4_;
    auVar65._4_4_ = local_1948._4_4_ & auVar59._4_4_;
    auVar65._8_4_ = local_1948._8_4_ & auVar59._8_4_;
    auVar65._12_4_ = local_1948._12_4_ & auVar59._12_4_;
    uVar46 = movmskps((int)uVar32,auVar65);
    if (uVar46 == 0) break;
  }
  uVar42 = CONCAT44(auVar65._4_4_,auVar65._0_4_);
  auVar75._0_8_ = uVar42 ^ 0xffffffffffffffff;
  auVar75._8_4_ = auVar65._8_4_ ^ 0xffffffff;
  auVar75._12_4_ = auVar65._12_4_ ^ 0xffffffff;
LAB_001b5084:
  local_19d8 = local_19d8 | auVar75;
  uVar46 = movmskps(uVar46,local_19d8);
  puVar30 = (undefined1 *)(ulong)uVar46;
  if (uVar46 == 0xf) goto LAB_001b50c3;
  local_1918 = (float)(~local_19d8._0_4_ & (uint)local_1918 | local_19d8._0_4_ & 0xff800000);
  fStack_1914 = (float)(~local_19d8._4_4_ & (uint)fStack_1914 | local_19d8._4_4_ & 0xff800000);
  fStack_1910 = (float)(~local_19d8._8_4_ & (uint)fStack_1910 | local_19d8._8_4_ & 0xff800000);
  fStack_190c = (float)(~local_19d8._12_4_ & (uint)fStack_190c | local_19d8._12_4_ & 0xff800000);
LAB_001b50b1:
  puVar43 = (undefined1 *)pNVar37[-1].ptr;
  pNVar37 = pNVar37 + -1;
  if (puVar43 == (undefined1 *)0xfffffffffffffff8) goto LAB_001b50c3;
  goto LAB_001b3b49;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }